

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O1

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::funcFromModel
          (LLVMReadWriteGraphBuilder *this,FunctionModel *model,CallInst *CInst)

{
  RWNode *pRVar1;
  bool bVar2;
  char cVar3;
  op_iterator pUVar4;
  Value *val;
  Offset OVar5;
  long lVar6;
  _Base_ptr p_Var7;
  raw_ostream *prVar8;
  RWNode *pRVar9;
  Offset OVar10;
  LLVMPointsToSetImpl *pLVar11;
  ulong uVar12;
  _Base_ptr p_Var13;
  undefined1 auVar14 [16];
  pair<dg::Offset,_dg::Offset> pVar15;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  const_iterator __begin3;
  const_iterator __end3;
  pair<bool,_dg::LLVMPointsToSet> pts;
  const_iterator local_b0;
  RWNode *local_a8;
  FunctionModel *local_a0;
  LLVMReadWriteGraphBuilder *local_98;
  RWNode *local_90;
  const_iterator local_88;
  char local_80 [8];
  LLVMPointsToSetImpl *local_78;
  _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
  *local_70;
  CallInst *local_68;
  _Base_ptr local_60;
  _Base_ptr local_58;
  Offset local_50;
  GenericDefSite<dg::dda::RWNode> local_48;
  
  local_98 = this;
  local_a8 = ReadWriteGraph::create(&this->graph,GENERIC);
  pUVar4 = llvm::CallBase::arg_end((CallBase *)CInst);
  pRVar1 = Offset::UNKNOWN;
  if ((int)((ulong)((long)pUVar4 -
                   (long)(CInst + (ulong)-(*(uint *)(CInst + 0x14) & 0x7ffffff) * 0x20)) >> 5) != 0)
  {
    local_58 = &(model->_defines)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_60 = &(model->_uses)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_70 = (_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
                *)&(local_a8->annotations).uses;
    uVar12 = 0;
    local_a0 = model;
    local_68 = CInst;
    do {
      bVar2 = FunctionModel::handles(model,(uint)uVar12);
      if (bVar2) {
        (**(code **)(*(long *)local_98->PTA + 0x10))
                  (local_80,local_98->PTA,
                   *(undefined8 *)
                    (CInst + (uVar12 * 0x20 - (ulong)(uint)(*(int *)(CInst + 0x14) << 5))));
        pLVar11 = local_78;
        if (local_80[0] == '\0') {
          prVar8 = (raw_ostream *)llvm::errs();
          Str.Length = 0x34;
          Str.Data = "[Warning]: did not find pt-set for modeled function\n";
          llvm::raw_ostream::operator<<(prVar8,Str);
          prVar8 = (raw_ostream *)llvm::errs();
          Str_00.Length = 0x11;
          Str_00.Data = "           Func: ";
          prVar8 = llvm::raw_ostream::operator<<(prVar8,Str_00);
          prVar8 = (raw_ostream *)
                   llvm::raw_ostream::write((char *)prVar8,(ulong)(model->name)._M_dataplus._M_p);
          Str_01.Length = 10;
          Str_01.Data = ", operand ";
          prVar8 = llvm::raw_ostream::operator<<(prVar8,Str_01);
          prVar8 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar8,uVar12);
          Str_02.Length = 1;
          Str_02.Data = "\n";
          llvm::raw_ostream::operator<<(prVar8,Str_02);
        }
        else {
          if ((local_78 != (LLVMPointsToSetImpl *)0x0) &&
             (cVar3 = (**(code **)(*(long *)local_78 + 0x38))(local_78), cVar3 != '\0')) {
            pLVar11 = (LLVMPointsToSetImpl *)0x0;
          }
          local_88.impl = (LLVMPointsToSetImpl *)0x0;
          local_b0.impl = pLVar11;
          bVar2 = LLVMPointsToSet::const_iterator::operator==(&local_b0,&local_88);
          model = local_a0;
          while (!bVar2) {
            auVar14 = (**(code **)(*(long *)local_b0.impl + 0x48))();
            pRVar9 = auVar14._8_8_;
            val = auVar14._0_8_;
            if (val[0x10] != (Value)0x0) {
              local_90 = getOperand(local_98,val);
              p_Var7 = local_58;
              for (p_Var13 = (model->_defines)._M_t._M_impl.super__Rb_tree_header._M_header.
                             _M_parent; p_Var13 != (_Base_ptr)0x0;
                  p_Var13 = (&p_Var13->_M_left)[p_Var13[1]._M_color < uVar12]) {
                if (uVar12 <= p_Var13[1]._M_color) {
                  p_Var7 = p_Var13;
                }
              }
              p_Var13 = local_58;
              if ((p_Var7 != local_58) && (p_Var13 = p_Var7, uVar12 < p_Var7[1]._M_color)) {
                p_Var13 = local_58;
              }
              if (p_Var13 != local_58) {
                pVar15 = getFromTo<dg::FunctionModel::Operand_const*>
                                   (CInst,(Operand *)&p_Var13[1]._M_parent);
                OVar10 = pVar15.second.offset;
                OVar5 = pVar15.first.offset;
                lVar6 = (**(code **)(*(long *)local_78 + 0x20))();
                bVar2 = false;
                if ((lVar6 == 1) && (bVar2 = false, pRVar9 != pRVar1)) {
                  bVar2 = false;
                  if (((pRVar1 != (RWNode *)OVar5.offset) &&
                      (((pRVar9 < (RWNode *)((long)pRVar1 - OVar5.offset) &&
                        (bVar2 = false, pRVar9 != pRVar1)) && (pRVar1 != (RWNode *)OVar10.offset))))
                     && (pRVar9 < (RWNode *)((long)pRVar1 - OVar10.offset))) {
                    bVar2 = val[0x10] != (Value)0x53;
                  }
                }
                local_50.offset = (type)((long)&pRVar9->_vptr_RWNode + OVar10.offset);
                if ((RWNode *)((long)pRVar1 - OVar10.offset) <= pRVar9) {
                  local_50.offset = (type)pRVar1;
                }
                if (pRVar1 == (RWNode *)OVar10.offset) {
                  local_50.offset = (type)pRVar1;
                }
                local_48.target = (RWNode *)((long)&pRVar9->_vptr_RWNode + OVar5.offset);
                if ((RWNode *)((long)pRVar1 - OVar5.offset) <= pRVar9) {
                  local_48.target = pRVar1;
                }
                if (pRVar1 == (RWNode *)OVar5.offset) {
                  local_48.target = pRVar1;
                }
                if (pRVar9 == pRVar1) {
                  local_50.offset = (type)pRVar1;
                  local_48.target = pRVar1;
                }
                RWNode::addDef(local_a8,local_90,(Offset *)&local_48,&local_50,bVar2);
                model = local_a0;
                CInst = local_68;
              }
              p_Var7 = local_60;
              for (p_Var13 = (model->_uses)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                  p_Var13 != (_Base_ptr)0x0;
                  p_Var13 = (&p_Var13->_M_left)[p_Var13[1]._M_color < uVar12]) {
                if (uVar12 <= p_Var13[1]._M_color) {
                  p_Var7 = p_Var13;
                }
              }
              p_Var13 = local_60;
              if ((p_Var7 != local_60) && (p_Var13 = p_Var7, uVar12 < p_Var7[1]._M_color)) {
                p_Var13 = local_60;
              }
              if (p_Var13 != local_60) {
                pVar15 = getFromTo<dg::FunctionModel::Operand_const*>
                                   (CInst,(Operand *)&p_Var13[1]._M_parent);
                OVar10 = pVar15.second.offset;
                OVar5 = pVar15.first.offset;
                local_48.len.offset = (type)((long)&pRVar9->_vptr_RWNode + OVar10.offset);
                if ((RWNode *)((long)pRVar1 - OVar10.offset) <= pRVar9) {
                  local_48.len.offset = (type)pRVar1;
                }
                if (pRVar1 == (RWNode *)OVar10.offset) {
                  local_48.len.offset = (type)pRVar1;
                }
                local_48.offset.offset = (type)((long)&pRVar9->_vptr_RWNode + OVar5.offset);
                if ((RWNode *)((long)pRVar1 - OVar5.offset) <= pRVar9) {
                  local_48.offset.offset = (type)pRVar1;
                }
                if (pRVar1 == (RWNode *)OVar5.offset) {
                  local_48.offset.offset = (type)pRVar1;
                }
                if (pRVar9 == pRVar1) {
                  local_48.len.offset = (type)pRVar1;
                  local_48.offset.offset = (type)pRVar1;
                }
                local_48.target = local_90;
                std::
                _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
                ::_M_insert_unique<dg::dda::GenericDefSite<dg::dda::RWNode>const&>
                          (local_70,&local_48);
              }
            }
            (**(code **)(*(long *)local_b0.impl + 0x40))();
            cVar3 = (**(code **)(*(long *)local_b0.impl + 0x38))();
            if (cVar3 != '\0') {
              local_b0.impl = (LLVMPointsToSetImpl *)0x0;
            }
            bVar2 = LLVMPointsToSet::const_iterator::operator==(&local_b0,&local_88);
          }
        }
        if (local_78 != (LLVMPointsToSetImpl *)0x0) {
          (**(code **)(*(long *)local_78 + 0x58))();
        }
      }
      uVar12 = uVar12 + 1;
      pUVar4 = llvm::CallBase::arg_end((CallBase *)CInst);
    } while (uVar12 < ((ulong)((long)pUVar4 -
                              (long)((CallBase *)CInst +
                                    (ulong)-(*(uint *)((CallBase *)CInst + 0x14) & 0x7ffffff) * 0x20
                                    )) >> 5 & 0xffffffff));
  }
  return local_a8;
}

Assistant:

RWNode *LLVMReadWriteGraphBuilder::funcFromModel(const FunctionModel *model,
                                                 const llvm::CallInst *CInst) {
    RWNode *node = &create(RWNodeType::GENERIC);

    for (unsigned int i = 0; i < llvmutils::getNumArgOperands(CInst); ++i) {
        if (!model->handles(i))
            continue;

        auto *const llvmOp = CInst->getArgOperand(i);
        auto pts = PTA->getLLVMPointsToChecked(llvmOp);
        // if we do not have a pts, this is not pointer
        // relevant instruction. We must do it this way
        // instead of type checking, due to the inttoptr.
        if (!pts.first) {
            llvm::errs()
                    << "[Warning]: did not find pt-set for modeled function\n";
            llvm::errs() << "           Func: " << model->name << ", operand "
                         << i << "\n";
            continue;
        }

        for (const auto &ptr : pts.second) {
            if (llvm::isa<llvm::Function>(ptr.value))
                // functions may not be redefined
                continue;

            RWNode *target = getOperand(ptr.value);
            assert(target && "Don't have pointer target for call argument");

            Offset from, to;
            if (const auto *defines = model->defines(i)) {
                std::tie(from, to) = getFromTo(CInst, defines);
                // this call may define this memory
                bool strong_updt = pts.second.size() == 1 &&
                                   !ptr.offset.isUnknown() &&
                                   !(ptr.offset + from).isUnknown() &&
                                   !(ptr.offset + to).isUnknown() &&
                                   !llvm::isa<llvm::CallInst>(ptr.value);
                // FIXME: what about vars in recursive functions?
                node->addDef(target, ptr.offset + from, ptr.offset + to,
                             strong_updt);
            }
            if (const auto *uses = model->uses(i)) {
                std::tie(from, to) = getFromTo(CInst, uses);
                // this call uses this memory
                node->addUse(target, ptr.offset + from, ptr.offset + to);
            }
        }
    }

    return node;
}